

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManMerge(If_DsdMan_t *p,If_DsdMan_t *pNew)

{
  uint uVar1;
  uint uVar2;
  Vec_Wrd_t *pVVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  If_DsdObj_t *pObj_00;
  int *pMap;
  word *__src;
  word *__dest;
  char *pcVar8;
  bool bVar9;
  word *local_d0;
  word *pConfigOld;
  word *pConfigNew;
  int Id;
  int iFanin;
  int k;
  int i;
  int pFanins [12];
  Vec_Int_t *vMap;
  If_DsdObj_t *pObj;
  If_DsdMan_t *pNew_local;
  If_DsdMan_t *p_local;
  
  if (p->nVars < pNew->nVars) {
    printf("The number of variables should be the same or smaller.\n");
  }
  else if (p->LutSize == pNew->LutSize) {
    if (p->nTtBits != pNew->nTtBits) {
      __assert_fail("p->nTtBits == pNew->nTtBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x4c1,"void If_DsdManMerge(If_DsdMan_t *, If_DsdMan_t *)");
    }
    if (p->nConfigWords != pNew->nConfigWords) {
      __assert_fail("p->nConfigWords == pNew->nConfigWords",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x4c2,"void If_DsdManMerge(If_DsdMan_t *, If_DsdMan_t *)");
    }
    iVar4 = If_DsdManHasMarks(p);
    iVar5 = If_DsdManHasMarks(pNew);
    if (iVar4 != iVar5) {
      iVar4 = If_DsdManHasMarks(p);
      pcVar7 = "no ";
      if (iVar4 != 0) {
        pcVar7 = "";
      }
      iVar4 = If_DsdManHasMarks(pNew);
      pcVar8 = "no ";
      if (iVar4 != 0) {
        pcVar8 = "";
      }
      printf("Warning! Old manager has %smarks while new manager has %smarks.\n",pcVar7,pcVar8);
    }
    iVar4 = Vec_PtrSize(&pNew->vObjs);
    pFanins._40_8_ = Vec_IntAlloc(iVar4);
    Vec_IntPush((Vec_Int_t *)pFanins._40_8_,0);
    Vec_IntPush((Vec_Int_t *)pFanins._40_8_,1);
    if ((p->vConfigs != (Vec_Wrd_t *)0x0) && (pNew->vConfigs != (Vec_Wrd_t *)0x0)) {
      pVVar3 = p->vConfigs;
      iVar4 = p->nConfigWords;
      iVar5 = Vec_PtrSize(&p->vObjs);
      iVar6 = Vec_PtrSize(&pNew->vObjs);
      Vec_WrdFillExtra(pVVar3,iVar4 * (iVar5 + iVar6),0);
    }
    for (iFanin = 2; iVar4 = Vec_PtrSize(&pNew->vObjs), iFanin < iVar4; iFanin = iFanin + 1) {
      pObj_00 = (If_DsdObj_t *)Vec_PtrEntry(&pNew->vObjs,iFanin);
      Id = 0;
      while( true ) {
        iVar4 = If_DsdObjFaninNum(pObj_00);
        bVar9 = false;
        if (Id < iVar4) {
          pConfigNew._4_4_ = If_DsdObjFaninLit(pObj_00,Id);
          bVar9 = pConfigNew._4_4_ != 0;
        }
        if (!bVar9) break;
        pMap = Vec_IntArray((Vec_Int_t *)pFanins._40_8_);
        iVar4 = Abc_Lit2LitV(pMap,pConfigNew._4_4_);
        (&k)[Id] = iVar4;
        Id = Id + 1;
      }
      uVar1 = *(uint *)&pObj_00->field_0x4;
      uVar2 = *(uint *)&pObj_00->field_0x4;
      if ((*(uint *)&pObj_00->field_0x4 & 7) == 6) {
        local_d0 = If_DsdObjTruth(pNew,pObj_00);
      }
      else {
        local_d0 = (word *)0x0;
      }
      iVar4 = If_DsdObjFindOrAdd(p,uVar1 & 7,&k,uVar2 >> 0x1b,local_d0);
      if ((*(uint *)&pObj_00->field_0x4 >> 8 & 1) != 0) {
        If_DsdVecObjSetMark(&p->vObjs,iVar4);
      }
      if (((p->vConfigs != (Vec_Wrd_t *)0x0) && (pNew->vConfigs != (Vec_Wrd_t *)0x0)) &&
         (iVar5 = p->nConfigWords, iVar6 = Vec_WrdSize(pNew->vConfigs), iVar5 * iFanin < iVar6)) {
        __src = Vec_WrdEntryP(pNew->vConfigs,p->nConfigWords * iFanin);
        __dest = Vec_WrdEntryP(p->vConfigs,p->nConfigWords * iVar4);
        memcpy(__dest,__src,(long)p->nConfigWords << 3);
      }
      Vec_IntPush((Vec_Int_t *)pFanins._40_8_,iVar4);
    }
    iVar4 = Vec_IntSize((Vec_Int_t *)pFanins._40_8_);
    iVar5 = Vec_PtrSize(&pNew->vObjs);
    if (iVar4 != iVar5) {
      __assert_fail("Vec_IntSize(vMap) == Vec_PtrSize(&pNew->vObjs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x4db,"void If_DsdManMerge(If_DsdMan_t *, If_DsdMan_t *)");
    }
    Vec_IntFree((Vec_Int_t *)pFanins._40_8_);
    if ((p->vConfigs != (Vec_Wrd_t *)0x0) && (pNew->vConfigs != (Vec_Wrd_t *)0x0)) {
      pVVar3 = p->vConfigs;
      iVar4 = p->nConfigWords;
      iVar5 = Vec_PtrSize(&p->vObjs);
      Vec_WrdShrink(pVVar3,iVar4 * iVar5);
    }
  }
  else {
    printf("LUT size should be the same.\n");
  }
  return;
}

Assistant:

void If_DsdManMerge( If_DsdMan_t * p, If_DsdMan_t * pNew )
{
    If_DsdObj_t * pObj; 
    Vec_Int_t * vMap;
    int pFanins[DAU_MAX_VAR];
    int i, k, iFanin, Id;
    if ( p->nVars < pNew->nVars )
    {
        printf( "The number of variables should be the same or smaller.\n" );
        return;
    }
    if ( p->LutSize != pNew->LutSize )
    {
        printf( "LUT size should be the same.\n" );
        return;
    }
    assert( p->nTtBits == pNew->nTtBits );
    assert( p->nConfigWords == pNew->nConfigWords );
    if ( If_DsdManHasMarks(p) != If_DsdManHasMarks(pNew) )
        printf( "Warning! Old manager has %smarks while new manager has %smarks.\n", 
            If_DsdManHasMarks(p) ? "" : "no ", If_DsdManHasMarks(pNew) ? "" : "no " );
    vMap = Vec_IntAlloc( Vec_PtrSize(&pNew->vObjs) );
    Vec_IntPush( vMap, 0 );
    Vec_IntPush( vMap, 1 );
    if ( p->vConfigs && pNew->vConfigs )
        Vec_WrdFillExtra( p->vConfigs, p->nConfigWords * (Vec_PtrSize(&p->vObjs) + Vec_PtrSize(&pNew->vObjs)), 0 );
    If_DsdVecForEachNode( &pNew->vObjs, pObj, i )
    {
        If_DsdObjForEachFaninLit( &pNew->vObjs, pObj, iFanin, k )
            pFanins[k] = Abc_Lit2LitV( Vec_IntArray(vMap), iFanin );
        Id = If_DsdObjFindOrAdd( p, pObj->Type, pFanins, pObj->nFans, pObj->Type == IF_DSD_PRIME ? If_DsdObjTruth(pNew, pObj) : NULL );
        if ( pObj->fMark )
            If_DsdVecObjSetMark( &p->vObjs, Id );
        if ( p->vConfigs && pNew->vConfigs && p->nConfigWords * i < Vec_WrdSize(pNew->vConfigs) )
        {
            //Vec_WrdFillExtra( p->vConfigs, Id, Vec_WrdEntry(pNew->vConfigs, i) );
            word * pConfigNew = Vec_WrdEntryP(pNew->vConfigs, p->nConfigWords * i);
            word * pConfigOld = Vec_WrdEntryP(p->vConfigs, p->nConfigWords * Id);
            memcpy( pConfigOld, pConfigNew, sizeof(word) * p->nConfigWords );
        }
        Vec_IntPush( vMap, Id );
    }
    assert( Vec_IntSize(vMap) == Vec_PtrSize(&pNew->vObjs) );
    Vec_IntFree( vMap );
    if ( p->vConfigs && pNew->vConfigs )
        Vec_WrdShrink( p->vConfigs, p->nConfigWords * Vec_PtrSize(&p->vObjs) );
}